

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void execute_instruction(Emulator *e)

{
  Ticks *pTVar1;
  u16 *puVar2;
  u8 uVar3;
  byte bVar4;
  ushort uVar5;
  CpuState CVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  ulong extraout_RAX;
  uint uVar11;
  Address addr;
  char *func_name;
  bool bVar12;
  
  if ((e->state).next_intr_ticks <= (e->state).ticks) {
    execute_instruction_cold_1();
  }
  CVar6 = (e->state).interrupt.state;
  bVar12 = false;
  if (CVar6 == CPU_STATE_NORMAL) {
    bVar7 = (e->state).interrupt.new_if;
    if ((e->state).interrupt.ime != FALSE) {
      bVar12 = ((e->state).interrupt.ie & bVar7) != 0;
    }
LAB_0018ee89:
    addr = (e->state).reg.PC;
LAB_0018ee90:
    (e->state).interrupt.if_ = bVar7;
    pTVar1 = &(e->state).ticks;
    *pTVar1 = *pTVar1 + (e->state).cpu_tick;
    bVar7 = read_u8(e,addr);
LAB_0018eeae:
    uVar11 = (uint)bVar7;
    if (bVar12) {
LAB_001914ea:
      intr_synchronize(e);
      dispatch_interrupt(e);
      return;
    }
  }
  else {
    switch(CVar6) {
    case CPU_STATE_STOP:
      if (((e->state).interrupt.ime == FALSE) ||
         (bVar12 = true, ((e->state).interrupt.new_if & (e->state).interrupt.ie) == 0)) {
        execute_instruction_cold_2();
        bVar12 = false;
        if ((extraout_RAX & 1) != 0) {
          return;
        }
      }
      addr = (e->state).reg.PC;
      bVar7 = (e->state).interrupt.new_if;
      goto LAB_0018ee90;
    case CPU_STATE_ENABLE_IME:
      bVar7 = (e->state).interrupt.new_if;
      if ((e->state).interrupt.ime == FALSE) {
        bVar12 = false;
      }
      else {
        bVar12 = ((e->state).interrupt.ie & bVar7) != 0;
      }
      (e->state).interrupt.ime = TRUE;
      (e->state).interrupt.state = CPU_STATE_NORMAL;
      goto LAB_0018ee89;
    case CPU_STATE_HALT_BUG:
      if ((e->state).interrupt.ime == FALSE) {
        bVar12 = false;
      }
      else {
        bVar12 = ((e->state).interrupt.new_if & (e->state).interrupt.ie) != 0;
      }
      bVar7 = read_u8(e,(e->state).reg.PC);
      puVar2 = &(e->state).reg.PC;
      *puVar2 = *puVar2 - 1;
      (e->state).interrupt.state = CPU_STATE_NORMAL;
      goto LAB_0018eeae;
    case CPU_STATE_HALT:
      bVar7 = (e->state).interrupt.new_if;
      pTVar1 = &(e->state).ticks;
      *pTVar1 = *pTVar1 + (e->state).cpu_tick;
      bVar4 = (e->state).interrupt.ie;
      (e->state).interrupt.if_ = bVar7;
      if ((bVar4 & bVar7) == 0) {
        return;
      }
      goto LAB_001914ea;
    case CPU_STATE_HALT_DI:
      bVar7 = (e->state).interrupt.new_if;
      bVar4 = (e->state).interrupt.ie;
      uVar5 = (e->state).reg.PC;
      func_name = (char *)(ulong)uVar5;
      (e->state).interrupt.if_ = bVar7;
      pTVar1 = &(e->state).ticks;
      *pTVar1 = *pTVar1 + (e->state).cpu_tick;
      bVar8 = read_u8(e,uVar5);
      if ((bVar4 & bVar7) == 0) {
        return;
      }
      uVar11 = (uint)bVar8;
      HOOK_interrupt_during_halt_di_v(e,func_name);
      (e->state).interrupt.state = CPU_STATE_NORMAL;
      break;
    default:
      uVar11 = 0;
    }
  }
  uVar5 = (e->state).reg.PC;
  if (uVar5 < 0x4000) {
    uVar9 = (uint)uVar5 | (e->state).memory_map_state.rom_base[0];
  }
  else {
    if ((short)uVar5 < 0) {
      uVar10 = 0xffffffff;
      goto LAB_0018ef50;
    }
    uVar9 = uVar5 & 0x3fff | (e->state).memory_map_state.rom_base[1];
  }
  uVar10 = (ulong)uVar9;
  if ((uVar9 != 0xffffffff) && (s_rom_usage_enabled != FALSE)) {
    if (0x7fffff < uVar9) {
LAB_00192baf:
      __assert_fail("rom_addr < ARRAY_SIZE(s_rom_usage)",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator-debug.c"
                    ,0x204,"void mark_rom_usage(u32, RomUsage)");
    }
    uVar3 = "\x01\x03\x01\x01\x01\x01\x02\x01\x03\x01\x01\x01\x01\x01\x02\x01\x01\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x03\x01\x02\x01\x01\x01\x03\x02\x03\x03\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01"
            [e->cart_info->data[uVar10]];
    s_rom_usage[uVar10] = s_rom_usage[uVar10] | 5;
    if (uVar3 == '\x02') {
      if (uVar9 == 0x7fffff) goto LAB_00192baf;
    }
    else {
      if (uVar3 != '\x03') goto LAB_0018ef50;
      if (0x7ffffd < uVar9) goto LAB_00192baf;
      s_rom_usage[uVar10 + 2] = s_rom_usage[uVar10 + 2] | 1;
    }
    s_rom_usage[uVar10 + 1] = s_rom_usage[uVar10 + 1] | 1;
  }
LAB_0018ef50:
  if (s_opcode_count_enabled != FALSE) {
    s_opcode_count[uVar11] = s_opcode_count[uVar11] + 1;
  }
  if (((int)uVar10 != -1) && (s_profiling_enabled != FALSE)) {
    s_profiling_counters[uVar10] = s_profiling_counters[uVar10] + 1;
  }
  (e->state).reg.PC = (e->state).reg.PC + 1;
  (*(code *)(&DAT_001becc4 + *(int *)(&DAT_001becc4 + (ulong)uVar11 * 4)))();
  return;
}

Assistant:

static void execute_instruction(Emulator* e) {
  u8 opcode = 0;
  s8 s;
  u8 u, c;
  u16 u16;
  Address new_pc;

  if (UNLIKELY(TICKS >= e->state.next_intr_ticks)) {
    if (TICKS >= TIMER.next_intr_ticks) {
      timer_synchronize(e);
    }
    if (TICKS >= SERIAL.next_intr_ticks) {
      serial_synchronize(e);
    }
    if (TICKS >= PPU.next_intr_ticks) {
      ppu_synchronize(e);
    }
  }

  Bool should_dispatch = FALSE;

  if (LIKELY(INTR.state == CPU_STATE_NORMAL)) {
    should_dispatch = INTR.ime && (INTR.new_if & INTR.ie) != 0;
    opcode = read_u8_tick(e, REG.PC);
  } else {
    switch (INTR.state) {
      case CPU_STATE_NORMAL:
        assert(0);

      case CPU_STATE_STOP:
        should_dispatch = INTR.ime && (INTR.new_if & INTR.ie) != 0;
        if (UNLIKELY(!should_dispatch)) {
          // TODO(binji): proper timing of speed switching.
          if (CPU_SPEED.switching) {
            intr_synchronize(e);
            CPU_SPEED.switching = FALSE;
            CPU_SPEED.speed ^= 1;
            INTR.state = CPU_STATE_NORMAL;
            if (CPU_SPEED.speed == SPEED_NORMAL) {
              e->state.cpu_tick = CPU_TICK;
              HOOK(speed_switch_i, 1);
            } else {
              e->state.cpu_tick = CPU_2X_TICK;
              HOOK(speed_switch_i, 2);
            }
          } else {
            TICKS += CPU_TICK;
            return;
          }
        }
        opcode = read_u8_tick(e, REG.PC);
        break;

      case CPU_STATE_ENABLE_IME:
        should_dispatch = INTR.ime && (INTR.new_if & INTR.ie) != 0;
        INTR.ime = TRUE;
        INTR.state = CPU_STATE_NORMAL;
        opcode = read_u8_tick(e, REG.PC);
        break;

      case CPU_STATE_HALT_BUG:
        /* When interrupts are disabled during a HALT, the following byte will
         * be duplicated when decoding. */
        should_dispatch = INTR.ime && (INTR.new_if & INTR.ie) != 0;
        opcode = read_u8(e, REG.PC);
        REG.PC--;
        INTR.state = CPU_STATE_NORMAL;
        break;

      case CPU_STATE_HALT:
        should_dispatch = (INTR.new_if & INTR.ie) != 0;
        tick(e);
        if (UNLIKELY(should_dispatch)) {
          intr_synchronize(e);
          dispatch_interrupt(e);
        }
        return;

      case CPU_STATE_HALT_DI:
        should_dispatch = (INTR.new_if & INTR.ie) != 0;
        opcode = read_u8_tick(e, REG.PC);
        if (UNLIKELY(should_dispatch)) {
          HOOK0(interrupt_during_halt_di_v);
          INTR.state = CPU_STATE_NORMAL;
          should_dispatch = FALSE;
          break;
        }
        return;
    }
  }

  if (UNLIKELY(should_dispatch)) {
    intr_synchronize(e);
    dispatch_interrupt(e);
    return;
  }

#define REG_OPS(code, name)            \
  case code + 0: name##_R(B); break;   \
  case code + 1: name##_R(C); break;   \
  case code + 2: name##_R(D); break;   \
  case code + 3: name##_R(E); break;   \
  case code + 4: name##_R(H); break;   \
  case code + 5: name##_R(L); break;   \
  case code + 6: name##_MR(HL); break; \
  case code + 7: name##_R(A); break;
#define REG_OPS_N(code, name, N)          \
  case code + 0: name##_R(N, B); break;   \
  case code + 1: name##_R(N, C); break;   \
  case code + 2: name##_R(N, D); break;   \
  case code + 3: name##_R(N, E); break;   \
  case code + 4: name##_R(N, H); break;   \
  case code + 5: name##_R(N, L); break;   \
  case code + 6: name##_MR(N, HL); break; \
  case code + 7: name##_R(N, A); break;
#define LD_R_OPS(code, R) REG_OPS_N(code, LD_R, R)

  HOOK(exec_op_ai, REG.PC, opcode);
  new_pc = ++REG.PC;

  switch (opcode) {
    case 0x00: break;
    case 0x01: LD_RR_NN(BC); break;
    case 0x02: LD_MR_R(BC, A); break;
    case 0x03: INC_RR(BC); break;
    case 0x04: INC_R(B); break;
    case 0x05: DEC_R(B); break;
    case 0x06: LD_R_N(B); break;
    case 0x07: RLCA; break;
    case 0x08: LD_MNN_SP; break;
    case 0x09: ADD_HL_RR(BC); break;
    case 0x0a: LD_R_MR(A, BC); break;
    case 0x0b: DEC_RR(BC); break;
    case 0x0c: INC_R(C); break;
    case 0x0d: DEC_R(C); break;
    case 0x0e: LD_R_N(C); break;
    case 0x0f: RRCA; break;
    case 0x10: STOP; break;
    case 0x11: LD_RR_NN(DE); break;
    case 0x12: LD_MR_R(DE, A); break;
    case 0x13: INC_RR(DE); break;
    case 0x14: INC_R(D); break;
    case 0x15: DEC_R(D); break;
    case 0x16: LD_R_N(D); break;
    case 0x17: RLA; break;
    case 0x18: JR_N; break;
    case 0x19: ADD_HL_RR(DE); break;
    case 0x1a: LD_R_MR(A, DE); break;
    case 0x1b: DEC_RR(DE); break;
    case 0x1c: INC_R(E); break;
    case 0x1d: DEC_R(E); break;
    case 0x1e: LD_R_N(E); break;
    case 0x1f: RRA; break;
    case 0x20: JR_F_N(!FZ); break;
    case 0x21: LD_RR_NN(HL); break;
    case 0x22: LD_MR_R(HL, A); REG.HL++; break;
    case 0x23: INC_RR(HL); break;
    case 0x24: INC_R(H); break;
    case 0x25: DEC_R(H); break;
    case 0x26: LD_R_N(H); break;
    case 0x27: DAA; break;
    case 0x28: JR_F_N(FZ); break;
    case 0x29: ADD_HL_RR(HL); break;
    case 0x2a: LD_R_MR(A, HL); REG.HL++; break;
    case 0x2b: DEC_RR(HL); break;
    case 0x2c: INC_R(L); break;
    case 0x2d: DEC_R(L); break;
    case 0x2e: LD_R_N(L); break;
    case 0x2f: CPL; break;
    case 0x30: JR_F_N(!FC); break;
    case 0x31: LD_RR_NN(SP); break;
    case 0x32: LD_MR_R(HL, A); REG.HL--; break;
    case 0x33: INC_RR(SP); break;
    case 0x34: INC_MR(HL); break;
    case 0x35: DEC_MR(HL); break;
    case 0x36: LD_MR_N(HL); break;
    case 0x37: SCF; break;
    case 0x38: JR_F_N(FC); break;
    case 0x39: ADD_HL_RR(SP); break;
    case 0x3a: LD_R_MR(A, HL); REG.HL--; break;
    case 0x3b: DEC_RR(SP); break;
    case 0x3c: INC_R(A); break;
    case 0x3d: DEC_R(A); break;
    case 0x3e: LD_R_N(A); break;
    case 0x3f: CCF; break;
    LD_R_OPS(0x40, B)
    LD_R_OPS(0x48, C)
    LD_R_OPS(0x50, D)
    LD_R_OPS(0x58, E)
    LD_R_OPS(0x60, H)
    LD_R_OPS(0x68, L)
    case 0x70: LD_MR_R(HL, B); break;
    case 0x71: LD_MR_R(HL, C); break;
    case 0x72: LD_MR_R(HL, D); break;
    case 0x73: LD_MR_R(HL, E); break;
    case 0x74: LD_MR_R(HL, H); break;
    case 0x75: LD_MR_R(HL, L); break;
    case 0x76: HALT; break;
    case 0x77: LD_MR_R(HL, A); break;
    LD_R_OPS(0x78, A)
    REG_OPS(0x80, ADD)
    REG_OPS(0x88, ADC)
    REG_OPS(0x90, SUB)
    REG_OPS(0x98, SBC)
    REG_OPS(0xa0, AND)
    REG_OPS(0xa8, XOR)
    REG_OPS(0xb0, OR)
    REG_OPS(0xb8, CP)
    case 0xc0: RET_F(!FZ); break;
    case 0xc1: POP_RR(BC); break;
    case 0xc2: JP_F_NN(!FZ); break;
    case 0xc3: JP_NN; break;
    case 0xc4: CALL_F_NN(!FZ); break;
    case 0xc5: PUSH_RR(BC); break;
    case 0xc6: ADD_N; break;
    case 0xc7: CALL(0x00); break;
    case 0xc8: RET_F(FZ); break;
    case 0xc9: RET; break;
    case 0xca: JP_F_NN(FZ); break;
    case 0xcb: {
      new_pc += 1;
      u8 cb = read_u8_tick(e, REG.PC);
      HOOK(exec_cb_op_i, cb);
      switch (cb) {
        REG_OPS(0x00, RLC)
        REG_OPS(0x08, RRC)
        REG_OPS(0x10, RL)
        REG_OPS(0x18, RR)
        REG_OPS(0x20, SLA)
        REG_OPS(0x28, SRA)
        REG_OPS(0x30, SWAP)
        REG_OPS(0x38, SRL)
        REG_OPS_N(0x40, BIT, 0)
        REG_OPS_N(0x48, BIT, 1)
        REG_OPS_N(0x50, BIT, 2)
        REG_OPS_N(0x58, BIT, 3)
        REG_OPS_N(0x60, BIT, 4)
        REG_OPS_N(0x68, BIT, 5)
        REG_OPS_N(0x70, BIT, 6)
        REG_OPS_N(0x78, BIT, 7)
        REG_OPS_N(0x80, RES, 0)
        REG_OPS_N(0x88, RES, 1)
        REG_OPS_N(0x90, RES, 2)
        REG_OPS_N(0x98, RES, 3)
        REG_OPS_N(0xa0, RES, 4)
        REG_OPS_N(0xa8, RES, 5)
        REG_OPS_N(0xb0, RES, 6)
        REG_OPS_N(0xb8, RES, 7)
        REG_OPS_N(0xc0, SET, 0)
        REG_OPS_N(0xc8, SET, 1)
        REG_OPS_N(0xd0, SET, 2)
        REG_OPS_N(0xd8, SET, 3)
        REG_OPS_N(0xe0, SET, 4)
        REG_OPS_N(0xe8, SET, 5)
        REG_OPS_N(0xf0, SET, 6)
        REG_OPS_N(0xf8, SET, 7)
      }
      break;
    }
    case 0xcc: CALL_F_NN(FZ); break;
    case 0xcd: CALL_NN; break;
    case 0xce: ADC_N; break;
    case 0xcf: CALL(0x08); break;
    case 0xd0: RET_F(!FC); break;
    case 0xd1: POP_RR(DE); break;
    case 0xd2: JP_F_NN(!FC); break;
    case 0xd4: CALL_F_NN(!FC); break;
    case 0xd5: PUSH_RR(DE); break;
    case 0xd6: SUB_N; break;
    case 0xd7: CALL(0x10); break;
    case 0xd8: RET_F(FC); break;
    case 0xd9: RETI; break;
    case 0xda: JP_F_NN(FC); break;
    case 0xdc: CALL_F_NN(FC); break;
    case 0xde: SBC_N; break;
    case 0xdf: CALL(0x18); break;
    case 0xe0: LD_MFF00_N_R(A); break;
    case 0xe1: POP_RR(HL); break;
    case 0xe2: LD_MFF00_R_R(C, A); break;
    case 0xe5: PUSH_RR(HL); break;
    case 0xe6: AND_N; break;
    case 0xe7: CALL(0x20); break;
    case 0xe8: ADD_SP_N; break;
    case 0xe9: JP_RR(HL); break;
    case 0xea: LD_MN_R(A); break;
    case 0xee: XOR_N; break;
    case 0xef: CALL(0x28); break;
    case 0xf0: LD_R_MFF00_N(A); break;
    case 0xf1: POP_AF; break;
    case 0xf2: LD_R_MFF00_R(A, C); break;
    case 0xf3: DI; break;
    case 0xf5: PUSH_AF; break;
    case 0xf6: OR_N; break;
    case 0xf7: CALL(0x30); break;
    case 0xf8: LD_HL_SP_N; break;
    case 0xf9: LD_RR_RR(SP, HL); break;
    case 0xfa: LD_R_MN(A); break;
    case 0xfb: EI; break;
    case 0xfe: CP_N; break;
    case 0xff: CALL(0x38); break;
    default:
      e->state.event |= EMULATOR_EVENT_INVALID_OPCODE;
      break;
  }
  REG.PC = new_pc;
}